

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_loop_expand.cpp
# Opt level: O3

void __thiscall
optimization::loop_expand::Const_Loop_Expand::optimize_func
          (Const_Loop_Expand *this,MirFunction *func)

{
  pointer puVar1;
  int iVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  uint extraout_var;
  pointer puVar5;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> vars;
  optional<optimization::loop_expand::loop_info> info;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_108;
  loop_info local_d8;
  _Storage<optimization::loop_expand::loop_info,_true> local_88;
  char local_38;
  
  find_loop_start((optional<optimization::loop_expand::loop_info> *)&local_88._M_value,func);
  if (local_38 == '\x01') {
    do {
      mir::inst::MirFunction::variable_table_size(func);
      local_108._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_108._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_108._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_108._M_impl.super__Rb_tree_header._M_header;
      local_108._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_108._M_impl.super__Rb_tree_header._M_header._M_right =
           local_108._M_impl.super__Rb_tree_header._M_header._M_left;
      pmVar3 = std::
               map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
               ::at(&func->basic_blks,(key_type *)&local_88);
      pmVar3 = std::
               map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
               ::at(&func->basic_blks,&(pmVar3->jump).bb_true);
      iVar2 = loop_info::get_times(&local_88._M_value);
      if (0x3f < iVar2) {
        std::
        _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
        ::~_Rb_tree(&local_108);
        return;
      }
      puVar1 = (pmVar3->inst).
               super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar5 = (pmVar3->inst).
                    super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1
          ) {
        iVar2 = (*(((puVar5->_M_t).
                    super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                    .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                  super_Displayable)._vptr_Displayable[1])();
        if (iVar2 != 7) {
          pmVar4 = std::
                   map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                   ::at(&func->variables,
                        &(((puVar5->_M_t).
                           super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                           .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->dest).id)
          ;
          (*(((pmVar4->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_Displayable)._vptr_Displayable[3])();
          if ((extraout_var & 1) == 0) {
            std::__throw_bad_optional_access();
          }
        }
      }
      if (local_38 == '\0') {
        std::__throw_bad_optional_access();
      }
      local_d8.loop_start = local_88._M_value.loop_start;
      local_d8.init_var.first.super_Displayable._vptr_Displayable =
           (_func_int **)&PTR_display_001eb100;
      local_d8.init_var.first.id = local_88._M_value.init_var.first.id;
      local_d8.init_var.second = local_88._M_value.init_var.second;
      local_d8.in_op = local_88._M_value.in_op;
      local_d8.in_value = local_88._M_value.in_value;
      local_d8.change_op = local_88._M_value.change_op;
      local_d8.change_value = local_88._M_value.change_value;
      local_d8.phi_var.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
      local_d8.phi_var.id = local_88._M_value.phi_var.id;
      local_d8.change_var.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
      local_d8.change_var.id = local_88._M_value.change_var.id;
      expand_loop(func,pmVar3,&local_d8);
      std::
      _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
      ::~_Rb_tree(&local_108);
      find_loop_start((optional<optimization::loop_expand::loop_info> *)&local_88._M_value,func);
    } while (local_38 != '\0');
  }
  return;
}

Assistant:

void Const_Loop_Expand::optimize_func(mir::inst::MirFunction& func) {
  auto& startblk = func.basic_blks.begin()->second;
  while (true) {
    auto info = find_loop_start(func);
    if (!info.has_value()) {
      break;
    }
    int size = func.variable_table_size();
    std::set<mir::inst::VarId> vars;
    auto& blk =
        func.basic_blks.at(func.basic_blks.at(info->loop_start).jump.bb_true);

    int times = info->get_times();
    if (times >= 64) {
      break;
    }
    for (auto& inst : blk.inst) {
      if (inst->inst_kind() == mir::inst::InstKind::Phi) {
        continue;
      }
      size += times * func.variables.at(inst->dest.id).size();
    }

    // if (size >= 1024) {
    //   return;
    // }
    expand_loop(func, blk, info.value());
  }
}